

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

int tcu::getBlockSize(CompressedTexFormat format)

{
  bool bVar1;
  int local_c;
  CompressedTexFormat format_local;
  
  bVar1 = isAstcFormat(format);
  if (bVar1) {
    local_c = 0x10;
  }
  else {
    bVar1 = isEtcFormat(format);
    if (bVar1) {
      switch(format) {
      case COMPRESSEDTEXFORMAT_ETC1_RGB8:
        local_c = 8;
        break;
      case COMPRESSEDTEXFORMAT_EAC_R11:
        local_c = 8;
        break;
      case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:
        local_c = 8;
        break;
      case COMPRESSEDTEXFORMAT_EAC_RG11:
        local_c = 0x10;
        break;
      case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:
        local_c = 0x10;
        break;
      case COMPRESSEDTEXFORMAT_ETC2_RGB8:
        local_c = 8;
        break;
      case COMPRESSEDTEXFORMAT_ETC2_SRGB8:
        local_c = 8;
        break;
      case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:
        local_c = 8;
        break;
      case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:
        local_c = 8;
        break;
      case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:
        local_c = 0x10;
        break;
      case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:
        local_c = 0x10;
        break;
      default:
        local_c = -1;
      }
    }
    else {
      local_c = -1;
    }
  }
  return local_c;
}

Assistant:

int getBlockSize (CompressedTexFormat format)
{
	if (isAstcFormat(format))
	{
		return astc::BLOCK_SIZE_BYTES;
	}
	else if (isEtcFormat(format))
	{
		switch (format)
		{
			case COMPRESSEDTEXFORMAT_ETC1_RGB8:							return 8;
			case COMPRESSEDTEXFORMAT_EAC_R11:							return 8;
			case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:					return 8;
			case COMPRESSEDTEXFORMAT_EAC_RG11:							return 16;
			case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:					return 16;
			case COMPRESSEDTEXFORMAT_ETC2_RGB8:							return 8;
			case COMPRESSEDTEXFORMAT_ETC2_SRGB8:						return 8;
			case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:		return 8;
			case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:	return 8;
			case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:					return 16;
			case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:				return 16;

			default:
				DE_ASSERT(false);
				return -1;
		}
	}
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}